

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O0

void duckdb::EncodingFunctionSet::Initialize(DBConfig *config)

{
  string *in_RDI;
  idx_t in_stack_fffffffffffffe70;
  allocator *lookup_bytes;
  idx_t in_stack_fffffffffffffe78;
  encode_t in_stack_fffffffffffffe80;
  allocator *encode_function;
  EncodingFunction *this;
  allocator local_161;
  string local_160 [111];
  allocator local_f1;
  string local_f0 [56];
  EncodingFunction *in_stack_ffffffffffffff48;
  DBConfig *in_stack_ffffffffffffff50;
  undefined1 local_71 [105];
  string *local_8;
  
  this = (EncodingFunction *)local_71;
  local_8 = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_71 + 1),"utf-8",(allocator *)this);
  EncodingFunction::EncodingFunction
            (this,in_RDI,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
  DBConfig::RegisterEncodeFunction(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  EncodingFunction::~EncodingFunction((EncodingFunction *)0x2a5ab01);
  ::std::__cxx11::string::~string((string *)(local_71 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_71);
  encode_function = &local_f1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f0,"latin-1",encode_function);
  EncodingFunction::EncodingFunction
            (this,in_RDI,(encode_t)encode_function,(idx_t)local_8,in_stack_fffffffffffffe70);
  DBConfig::RegisterEncodeFunction(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  EncodingFunction::~EncodingFunction((EncodingFunction *)0x2a5ab9f);
  ::std::__cxx11::string::~string(local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  lookup_bytes = &local_161;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_160,"utf-16",lookup_bytes);
  EncodingFunction::EncodingFunction
            (this,in_RDI,(encode_t)encode_function,(idx_t)local_8,(idx_t)lookup_bytes);
  DBConfig::RegisterEncodeFunction(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  EncodingFunction::~EncodingFunction((EncodingFunction *)0x2a5ac27);
  ::std::__cxx11::string::~string(local_160);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
  return;
}

Assistant:

void EncodingFunctionSet::Initialize(DBConfig &config) {
	config.RegisterEncodeFunction({"utf-8", DecodeUTF8, 1, 1});
	config.RegisterEncodeFunction({"latin-1", DecodeLatin1ToUTF8, 2, 1});
	config.RegisterEncodeFunction({"utf-16", DecodeUTF16ToUTF8, 2, 2});
}